

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_state.c
# Opt level: O2

void setup_simple_state_c(kcc_kinematic_chain *kc,solver_state_c *s)

{
  size_t __nmemb;
  uint uVar1;
  gc_pose *pgVar2;
  gc_twist *pgVar3;
  gc_acc_twist *pgVar4;
  gc_acc_twist *pgVar5;
  gc_acc_twist *pgVar6;
  gc_acc_twist *pgVar7;
  gc_acc_twist *pgVar8;
  mc_abi *pmVar9;
  mc_momentum *pmVar10;
  mc_wrench *pmVar11;
  mc_wrench *pmVar12;
  mc_wrench *pmVar13;
  mc_wrench *pmVar14;
  joint_torque *pjVar15;
  mc_wrench *pmVar16;
  mc_wrench *pmVar17;
  mc_wrench *pmVar18;
  mc_wrench *pmVar19;
  joint_position *pjVar20;
  joint_velocity *pjVar21;
  joint_acceleration *pjVar22;
  ulong uVar23;
  void *pvVar24;
  int i;
  long lVar25;
  size_t __nmemb_00;
  long lVar26;
  
  uVar1 = kc->number_of_segments;
  __nmemb_00 = (size_t)(int)uVar1;
  __nmemb = __nmemb_00 + 1;
  s->nbody = uVar1;
  s->nq = uVar1;
  s->nd = uVar1;
  pgVar2 = (gc_pose *)calloc(__nmemb_00,0x10);
  s->x_jnt = pgVar2;
  pgVar2 = (gc_pose *)calloc(__nmemb_00,0x10);
  s->x_rel = pgVar2;
  pgVar2 = (gc_pose *)calloc(__nmemb,0x10);
  s->x_tot = pgVar2;
  pgVar3 = (gc_twist *)calloc(__nmemb_00,0x10);
  s->xd_jnt = pgVar3;
  pgVar3 = (gc_twist *)calloc(__nmemb_00,0x10);
  s->xd_tf = pgVar3;
  pgVar3 = (gc_twist *)calloc(__nmemb,0x10);
  s->xd = pgVar3;
  pgVar4 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_jnt = pgVar4;
  pgVar5 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_net = pgVar5;
  pgVar6 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_bias = pgVar6;
  pgVar7 = (gc_acc_twist *)calloc(__nmemb,0x10);
  s->xdd_tf = pgVar7;
  pgVar7 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_nact = pgVar7;
  pgVar8 = (gc_acc_twist *)calloc(__nmemb,0x10);
  s->xdd = pgVar8;
  pmVar9 = (mc_abi *)calloc(__nmemb,0xd8);
  s->m_art = pmVar9;
  pmVar9 = (mc_abi *)calloc(__nmemb_00,0xd8);
  s->m_app = pmVar9;
  pmVar9 = (mc_abi *)calloc(__nmemb,0xd8);
  s->m_tf = pmVar9;
  pmVar10 = (mc_momentum *)calloc(__nmemb_00,0x10);
  s->p = pmVar10;
  pmVar11 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_bias_art = pmVar11;
  pmVar11 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_eom = pmVar11;
  pmVar12 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_app = pmVar12;
  pmVar13 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_tf = pmVar13;
  pmVar14 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_nact = pmVar14;
  pjVar15 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_bias_art = pjVar15;
  pmVar16 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_ff_art = pmVar16;
  pmVar16 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ff_app = pmVar16;
  pmVar17 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ff_jnt = pmVar17;
  pjVar15 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ff_art = pjVar15;
  pjVar15 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ff = pjVar15;
  pmVar18 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext = pmVar18;
  pmVar19 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_ext_art = pmVar19;
  pmVar19 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext_app = pmVar19;
  pmVar19 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext_tf = pmVar19;
  pjVar15 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ext_art = pjVar15;
  pjVar20 = (joint_position *)calloc(__nmemb_00,8);
  s->q = pjVar20;
  pjVar21 = (joint_velocity *)calloc(__nmemb_00,8);
  s->qd = pjVar21;
  pjVar22 = (joint_acceleration *)calloc(__nmemb_00,8);
  s->qdd = pjVar22;
  pjVar15 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ctrl = pjVar15;
  lVar25 = 0;
  uVar23 = 0;
  if (0 < (int)uVar1) {
    uVar23 = (ulong)uVar1;
  }
  for (; lVar26 = 8, uVar23 << 4 != lVar25; lVar25 = lVar25 + 0x10) {
    pvVar24 = calloc(1,0x48);
    pgVar2 = s->x_jnt;
    *(void **)((long)&pgVar2->rotation + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar2->translation + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x48);
    pgVar2 = s->x_rel;
    *(void **)((long)&pgVar2->rotation + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar2->translation + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pgVar3 = s->xd_jnt;
    *(void **)((long)&pgVar3->angular_velocity + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar3->linear_velocity + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pgVar3 = s->xd_tf;
    *(void **)((long)&pgVar3->angular_velocity + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar3->linear_velocity + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar4->angular_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar4->linear_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar6->angular_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar6->linear_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar5->angular_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar5->linear_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar7->angular_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar7->linear_acceleration + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar10->angular_momentum + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar10->linear_momentum + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar11->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar11->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar12->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar12->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar13->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar13->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar14->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar14->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar16->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar16->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar17->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar17->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar18->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar18->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pmVar19 = s->f_ext_app;
    *(void **)((long)&pmVar19->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar19->force + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pmVar19 = s->f_ext_tf;
    *(void **)((long)&pmVar19->torque + lVar25) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar19->force + lVar25) = pvVar24;
  }
  for (lVar25 = 0; lVar25 <= (long)__nmemb_00; lVar25 = lVar25 + 1) {
    pvVar24 = calloc(1,0x48);
    pgVar2 = s->x_tot;
    *(void **)((long)pgVar2 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar2->rotation + lVar26) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pgVar3 = s->xd;
    *(void **)((long)pgVar3 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar3->angular_velocity + lVar26) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pgVar4 = s->xdd;
    *(void **)((long)pgVar4 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar4->angular_acceleration + lVar26) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pgVar4 = s->xdd_tf;
    *(void **)((long)pgVar4 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pgVar4->angular_acceleration + lVar26) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pmVar11 = s->f_bias_art;
    *(void **)((long)pmVar11 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar11->torque + lVar26) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pmVar11 = s->f_ff_art;
    *(void **)((long)pmVar11 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar11->torque + lVar26) = pvVar24;
    pvVar24 = calloc(1,0x18);
    pmVar11 = s->f_ext_art;
    *(void **)((long)pmVar11 + lVar26 + -8) = pvVar24;
    pvVar24 = calloc(1,0x18);
    *(void **)((long)&pmVar11->torque + lVar26) = pvVar24;
    lVar26 = lVar26 + 0x10;
  }
  *(undefined8 *)&s->x_tot->rotation->field_0 = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x40) = 0x3ff0000000000000;
  return;
}

Assistant:

void setup_simple_state_c(
        const struct kcc_kinematic_chain *kc,
        struct solver_state_c *s)
{
    const int NR_SEGMENTS = kc->number_of_segments;
    const int NR_SEGMENTS_WITH_BASE = NR_SEGMENTS + 1;
    const int EE = NR_SEGMENTS;

    // FPK
    s->nbody = NR_SEGMENTS;
    s->nq = NR_SEGMENTS;
    // FVK
    s->nd = NR_SEGMENTS;

    // FPK
    s->x_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_rel = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_tot = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_pose));
    // FVK
    s->xd_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd_tf  = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd     = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_twist));
    // FAK
    s->xdd_jnt   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_net   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_bias  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_tf    = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    s->xdd_nact  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd       = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    // Inertia
    s->m_art = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    s->m_app = calloc(NR_SEGMENTS, sizeof(struct mc_abi));
    s->m_tf  = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    // Inertial force
    s->p            = calloc(NR_SEGMENTS, sizeof(struct mc_momentum));
    s->f_bias_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_bias_eom   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_nact  = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_bias_art = calloc(s->nd, sizeof(joint_torque));
    // Feed-forward torque
    s->f_ff_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ff_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ff_jnt   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ff_art = calloc(s->nd, sizeof(joint_torque));
    // External force
    s->tau_ff      = calloc(s->nd, sizeof(joint_torque));
    s->f_ext       = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ext_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ext_art = calloc(s->nd, sizeof(joint_torque));

    // FPK
    s->q     = calloc(s->nq, sizeof(double));
    // FVK
    s->qd    = calloc(s->nd, sizeof(double));
    // FAK
    s->qdd   = calloc(s->nd, sizeof(double));
    // Dynamics
    s->tau_ctrl = calloc(s->nd, sizeof(joint_torque));

    for (int i = 0; i < NR_SEGMENTS; i++) {
        // FPK
        s->x_jnt[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_jnt[i].translation = calloc(1, sizeof(struct vector3));
        s->x_rel[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_rel[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd_jnt[i].angular_velocity = calloc(1, sizeof(struct vector3));
        s->xd_jnt[i].linear_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].angular_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].linear_velocity   = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd_jnt[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_jnt[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->p[i].angular_momentum = calloc(1, sizeof(struct vector3));
        s->p[i].linear_momentum  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].torque   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].force    = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext[i].torque     = calloc(1, sizeof(struct vector3));
        s->f_ext[i].force      = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].force   = calloc(1, sizeof(struct vector3));
    }

    for (int i = 0; i < NR_SEGMENTS_WITH_BASE; i++) {
        // FPK
        s->x_tot[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_tot[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd[i].angular_velocity        = calloc(1, sizeof(struct vector3));
        s->xd[i].linear_velocity         = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd[i].angular_acceleration    = calloc(1, sizeof(struct vector3));
        s->xdd[i].linear_acceleration     = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->f_bias_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_art[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_art[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_art[i].force  = calloc(1, sizeof(struct vector3));
    }

    // FPK
    s->x_tot[0].rotation->row_x.x = 1.0;
    s->x_tot[0].rotation->row_y.y = 1.0;
    s->x_tot[0].rotation->row_z.z = 1.0;
}